

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

uint64_t __thiscall DnsStats::GetLeaksRef(DnsStats *this)

{
  DnsHashEntry *pDVar1;
  uint32_t auVar2 [2];
  int local_8c;
  uint32_t uStack_88;
  int i;
  uint32_t rcode [2];
  uint64_t leaks_ref;
  DnsHashEntry *r_key;
  DnsHashEntry key;
  DnsStats *this_local;
  
  key.field_6._56_8_ = this;
  DnsHashEntry::DnsHashEntry((DnsHashEntry *)&r_key);
  rcode[0] = 0;
  rcode[1] = 0;
  _uStack_88 = 3;
  for (local_8c = 0; auVar2 = rcode, local_8c < 2; local_8c = local_8c + 1) {
    key.hash = 0;
    key.registry_id = 0;
    key.HashNext._0_4_ = 0;
    key.HashNext._4_4_ = 0x1b;
    key.count._4_4_ = 4;
    key.count._0_4_ = 0;
    key.key_type = (&uStack_88)[local_8c];
    pDVar1 = BinHash<DnsHashEntry>::Retrieve(&this->hashTable,(DnsHashEntry *)&r_key);
    if (pDVar1 != (DnsHashEntry *)0x0) {
      rcode = (uint32_t  [2])(pDVar1->count + (long)rcode);
    }
  }
  DnsHashEntry::~DnsHashEntry((DnsHashEntry *)&r_key);
  rcode[0] = auVar2[0];
  rcode[1] = auVar2[1];
  auVar2[0] = rcode[0];
  auVar2[1] = rcode[1];
  return (uint64_t)auVar2;
}

Assistant:

uint64_t DnsStats::GetLeaksRef()
{
    DnsHashEntry key;
    DnsHashEntry * r_key;
    uint64_t leaks_ref = 0;
    const uint32_t rcode[2] = { DNS_RCODE_NXDOMAIN, DNS_RCODE_NOERROR };

    for (int i = 0; i < 2; i++) {
        key.count = 0;
        key.hash = 0;
        key.registry_id = REGISTRY_DNS_root_QR;
        key.key_length = sizeof(uint32_t);
        key.key_type = 0; /* number */
        key.key_number = rcode[i];

        r_key = (DnsHashEntry*)hashTable.Retrieve(&key);
        if (r_key != NULL) {
            leaks_ref += r_key->count;
        }
    }

    return leaks_ref;
}